

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void add_stream(c2m_ctx_t c2m_ctx,FILE *f,char *fname,_func_int_c2m_ctx_t *getc_func)

{
  FILE *__stream;
  stream_t psVar1;
  
  if (fname != (char *)0x0) {
    psVar1 = c2m_ctx->cs;
    if (((psVar1 != (stream_t)0x0) && (__stream = (FILE *)psVar1->f, __stream != (FILE *)0x0)) &&
       (__stream != _stdin)) {
      fgetpos(__stream,(fpos_t *)&psVar1->fpos);
      fclose((FILE *)c2m_ctx->cs->f);
      c2m_ctx->cs->f = (FILE *)0x0;
    }
    psVar1 = new_stream(f,fname,getc_func);
    c2m_ctx->cs = psVar1;
    VARR_stream_tpush(c2m_ctx->streams,psVar1);
    return;
  }
  __assert_fail("fname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x3ad,"void add_stream(c2m_ctx_t, FILE *, const char *, int (*)(c2m_ctx_t))");
}

Assistant:

static void add_stream (c2m_ctx_t c2m_ctx, FILE *f, const char *fname,
                        int (*getc_func) (c2m_ctx_t)) {
  assert (fname != NULL);
  if (cs != NULL && cs->f != NULL && cs->f != stdin) {
    fgetpos (cs->f, &cs->fpos);
    fclose (cs->f);
    cs->f = NULL;
  }
  cs = new_stream (f, fname, getc_func);
  VARR_PUSH (stream_t, streams, cs);
}